

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_viewOps.cpp
# Opt level: O1

string_view gmlc::utilities::string_viewOps::merge(string_view string1,string_view string2)

{
  char *pcVar1;
  out_of_range *this;
  char *pcVar2;
  size_t sVar3;
  char *pcVar4;
  size_t sVar5;
  bool bVar6;
  string_view sVar7;
  
  pcVar4 = string1._M_str;
  sVar5 = string1._M_len;
  pcVar2 = string2._M_str;
  sVar3 = string2._M_len;
  pcVar1 = pcVar2 + (-sVar5 - (long)pcVar4);
  if (pcVar1 < (char *)0x18) {
    pcVar2 = pcVar4;
    sVar3 = sVar3 + sVar5 + (long)pcVar1;
  }
  else if ((sVar5 != 0) && (bVar6 = sVar3 != 0, pcVar2 = pcVar4, sVar3 = sVar5, bVar6)) {
    this = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(this,"unable to merge string_views");
    __cxa_throw(this,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  sVar7._M_str = pcVar2;
  sVar7._M_len = sVar3;
  return sVar7;
}

Assistant:

std::string_view merge(std::string_view string1, std::string_view string2)
{
    ptrdiff_t diff = (string2.data() - string1.data()) -
        static_cast<ptrdiff_t>(string1.length());
    if ((diff >= 0) &&
        (diff < 24))  // maximum of 23 characters between the strings
    {
        return {string1.data(), diff + string1.length() + string2.length()};
    }
    if (string1.empty()) {
        return string2;
    }
    if (string2.empty()) {
        return string1;
    }
    throw(std::out_of_range("unable to merge string_views"));
}